

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::ImageCopyToBuffer::~ImageCopyToBuffer(ImageCopyToBuffer *this)

{
  ~ImageCopyToBuffer(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

~ImageCopyToBuffer	(void) {}